

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_regex(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t len;
  
  uVar3 = bson_new();
  cVar1 = bson_append_regex(uVar3,"regex",0xffffffffffffffff,"^abcd","xi");
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_regex (b, \"regex\", -1, \"^abcd\", \"xi\")";
    uVar3 = 0x215;
  }
  else {
    cVar1 = bson_append_regex(uVar3,"escaping",0xffffffffffffffff,"^\"","");
    if (cVar1 == '\0') {
      pcVar4 = "bson_append_regex (b, \"escaping\", -1, \"^\\\"\", \"\")";
      uVar3 = 0x216;
    }
    else {
      cVar1 = bson_append_regex(uVar3,"ordered",0xffffffffffffffff,"^abcd","ilmsux");
      if (cVar1 == '\0') {
        pcVar4 = "bson_append_regex (b, \"ordered\", -1, \"^abcd\", \"ilmsux\")";
        uVar3 = 0x217;
      }
      else {
        cVar1 = bson_append_regex(uVar3,"unordered",0xffffffffffffffff,"^abcd","xusmli");
        if (cVar1 == '\0') {
          pcVar4 = "bson_append_regex (b, \"unordered\", -1, \"^abcd\", \"xusmli\")";
          uVar3 = 0x218;
        }
        else {
          cVar1 = bson_append_regex(uVar3,"duplicate",0xffffffffffffffff,"^abcd","mmiii");
          if (cVar1 == '\0') {
            pcVar4 = "bson_append_regex (b, \"duplicate\", -1, \"^abcd\", \"mmiii\")";
            uVar3 = 0x219;
          }
          else {
            cVar1 = bson_append_regex(uVar3,"unsupported",0xffffffffffffffff,"^abcd","jkmlvz");
            if (cVar1 != '\0') {
              pcVar4 = (char *)bson_as_json(uVar3,&len);
              if (pcVar4 != 
                  "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
                 ) {
                iVar2 = strcmp(pcVar4,
                               "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
                              );
                if (iVar2 != 0) {
                  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar4,
                          "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
                         );
                  abort();
                }
              }
              bson_free(pcVar4);
              bson_destroy(uVar3);
              return;
            }
            pcVar4 = "bson_append_regex (b, \"unsupported\", -1, \"^abcd\", \"jkmlvz\")";
            uVar3 = 0x21a;
          }
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_regex",pcVar4);
  abort();
}

Assistant:

static void
test_bson_as_json_regex (void)
{
   bson_t *b;
   char *str;
   size_t len;

   b = bson_new ();
   BSON_ASSERT (bson_append_regex (b, "regex", -1, "^abcd", "xi"));
   BSON_ASSERT (bson_append_regex (b, "escaping", -1, "^\"", ""));
   BSON_ASSERT (bson_append_regex (b, "ordered", -1, "^abcd", "ilmsux"));
   BSON_ASSERT (bson_append_regex (b, "unordered", -1, "^abcd", "xusmli"));
   BSON_ASSERT (bson_append_regex (b, "duplicate", -1, "^abcd", "mmiii"));
   BSON_ASSERT (bson_append_regex (b, "unsupported", -1, "^abcd", "jkmlvz"));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ix\" },"
                  " \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" "
                  ": \"\" },"
                  " \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ilmsux\" },"
                  " \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ilmsux\" },"
                  " \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"im\" },"
                  " \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"lm\" } }");

   bson_free (str);
   bson_destroy (b);
}